

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

Resource res_getTableItemByKey_63(ResourceData *pResData,Resource table,int32_t *indexR,char **key)

{
  ushort *puVar1;
  ushort uVar2;
  char *key_00;
  uint uVar3;
  int iVar4;
  int32_t iVar5;
  int32_t **ppiVar6;
  uint16_t *puVar7;
  Resource RVar8;
  char *__s2;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  RVar8 = 0xffffffff;
  if ((key != (char **)0x0) && (key_00 = *key, key_00 != (char *)0x0)) {
    uVar3 = table & 0xfffffff;
    uVar9 = table >> 0x1c;
    if (uVar9 == 5) {
      puVar1 = pResData->p16BitUnits + uVar3;
      uVar2 = *puVar1;
      iVar5 = _res_findTableItem(pResData,puVar1 + 1,(uint)uVar2,key_00,key);
      *indexR = iVar5;
      if (-1 < iVar5) {
        uVar3 = (uint)(puVar1 + 1)[iVar5 + (uint)uVar2];
        if (pResData->poolStringIndex16Limit <= (int)uVar3) {
          uVar3 = (uVar3 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
        }
        RVar8 = uVar3 | 0x60000000;
      }
    }
    else if (uVar9 == 4) {
      if (uVar3 != 0) {
        uVar9 = pResData->pRoot[uVar3];
        if (0 < (int)uVar9) {
          puVar7 = (uint16_t *)(pResData->pRoot + (ulong)uVar3 + 1);
          iVar12 = 0;
          uVar10 = (ulong)uVar9;
          do {
            uVar3 = (uint)(iVar12 + (int)uVar10) >> 1;
            uVar11 = (ulong)uVar3;
            ppiVar6 = &pResData->pRoot;
            if ((int)*(uint *)(puVar7 + uVar11 * 2) < 0) {
              ppiVar6 = (int32_t **)&pResData->poolBundleKeys;
            }
            __s2 = (char *)((ulong)(*(uint *)(puVar7 + uVar11 * 2) & 0x7fffffff) + (long)*ppiVar6);
            iVar4 = strcmp(key_00,__s2);
            if (-1 < iVar4) {
              if (iVar4 == 0) {
                *key = __s2;
                *indexR = uVar3;
                uVar9 = uVar9 + uVar3;
                goto LAB_002fbad5;
              }
              iVar12 = uVar3 + 1;
              uVar11 = uVar10;
            }
            uVar10 = uVar11;
          } while (iVar12 < (int)uVar11);
        }
        *indexR = -1;
        RVar8 = 0xffffffff;
      }
    }
    else if ((uVar9 == 2) && (uVar3 != 0)) {
      puVar1 = (ushort *)(pResData->pRoot + uVar3);
      uVar2 = *puVar1;
      uVar9 = _res_findTableItem(pResData,puVar1 + 1,(uint)uVar2,key_00,key);
      *indexR = uVar9;
      if (-1 < (int)uVar9) {
        puVar7 = puVar1 + 1 + (ulong)uVar2 + (ulong)(~(uint)uVar2 & 1);
LAB_002fbad5:
        RVar8 = *(Resource *)(puVar7 + (ulong)uVar9 * 2);
      }
    }
  }
  return RVar8;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByKey(const ResourceData *pResData, Resource table,
                      int32_t *indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    int32_t idx;
    if(key == NULL || *key == NULL) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset!=0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
            if(idx>=0) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                return p32[idx];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        *indexR=idx=_res_findTableItem(pResData, p, length, *key, key);
        if(idx>=0) {
            return makeResourceFrom16(pResData, p[length+idx]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset!=0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            *indexR=idx=_res_findTable32Item(pResData, p, length, *key, key);
            if(idx>=0) {
                return (Resource)p[length+idx];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}